

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pointer.h
# Opt level: O0

ICommand * __thiscall
GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->
          (CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *this)

{
  ExceptionReporter<GenICam_3_4::LogicalErrorException> *this_00;
  char *in_RDI;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  ExceptionReporter<GenICam_3_4::LogicalErrorException> *in_stack_ffffffffffffff50;
  
  if (*(long *)(in_RDI + 8) == 0) {
    this_00 = (ExceptionReporter<GenICam_3_4::LogicalErrorException> *)
              __cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::LogicalErrorException>::ExceptionReporter
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_RDI)
    ;
    GenICam_3_4::ExceptionReporter<GenICam_3_4::LogicalErrorException>::Report
              (this_00,&stack0xffffffffffffff50,"NULL pointer dereferenced");
    __cxa_throw(this_00,&GenICam_3_4::LogicalErrorException::typeinfo,
                GenICam_3_4::LogicalErrorException::~LogicalErrorException);
  }
  return *(ICommand **)(in_RDI + 8);
}

Assistant:

T* operator->(void) const
        {
            if (NULL == m_pT)
                throw LOGICAL_ERROR_EXCEPTION( "NULL pointer dereferenced" );
            return m_pT;
        }